

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

void __thiscall HdlcAnalyzer::SetupResults(HdlcAnalyzer *this)

{
  HdlcAnalyzerResults *pHVar1;
  HdlcAnalyzerResults *this_00;
  
  this_00 = (HdlcAnalyzerResults *)operator_new(0x20);
  HdlcAnalyzerResults::HdlcAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  pHVar1 = (this->mResults)._M_ptr;
  if (pHVar1 != this_00) {
    if (pHVar1 != (HdlcAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pHVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void HdlcAnalyzer::SetupResults()
{
    mResults.reset( new HdlcAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}